

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

_Bool av1_cnn_predict_c(float **input,int in_width,int in_height,int in_stride,
                       CNN_CONFIG *cnn_config,CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct)

{
  CNN_LAYER_CONFIG *layer_config;
  AVxWorker *pAVar1;
  float *pfVar2;
  _Bool _Var3;
  uint uVar4;
  AVxWorkerInterface *pAVar5;
  long *plVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  float **ppfVar11;
  int *piVar12;
  byte bVar13;
  CNN_THREAD_DATA *pCVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int b;
  undefined1 *puVar18;
  uint uVar19;
  TENSOR *layer_active_tensor;
  TENSOR *tensor;
  bool bVar20;
  int o_height;
  int o_width;
  float **output [4];
  TENSOR tensor2 [4];
  CONVOLVE_OPS convolve_ops [32];
  TENSOR tensor1 [4];
  int local_51fc;
  int local_51f8;
  int local_51f4;
  uint local_51f0;
  int local_51ec;
  ulong local_51e8;
  ulong local_51e0;
  CNN_THREAD_DATA *local_51d8;
  uint local_51d0;
  int local_51cc;
  undefined1 *local_51c8;
  long local_51c0;
  long local_51b8;
  int local_51ac;
  int local_51a8;
  int local_51a4;
  float **local_51a0;
  int *local_5198;
  TENSOR *local_5190;
  CNN_CONFIG *local_5188;
  CNN_LAYER_CONFIG *local_5180;
  long local_5178;
  TENSOR *local_5170;
  float **local_5168;
  ulong local_5160;
  float **local_5158;
  long alStack_5150 [4];
  TENSOR local_5130;
  undefined1 local_4918 [32];
  undefined1 local_48f8 [16];
  float *apfStack_48e8 [1030];
  TENSOR local_28b8;
  TENSOR local_2098 [4];
  
  local_51d8 = thread_data;
  local_51d0 = in_width;
  local_51cc = in_height;
  local_51ac = in_stride;
  local_51a0 = input;
  memset(local_2098,0,0x2060);
  memset(local_4918,0,0x2060);
  piVar12 = output_struct->output_channels;
  local_5158 = output_struct->output_buffer;
  iVar10 = output_struct->num_outputs;
  if (1 < (long)iVar10) {
    lVar16 = 0;
    ppfVar11 = local_5158;
    do {
      ppfVar11 = ppfVar11 + piVar12[lVar16];
      alStack_5150[lVar16] = (long)ppfVar11;
      lVar16 = lVar16 + 1;
    } while ((long)iVar10 + -1 != lVar16);
  }
  local_51f8 = 0;
  local_51fc = 0;
  memset(local_2098,0,0x2060);
  memset(local_4918,0,0x2060);
  if (0 < cnn_config->num_layers) {
    local_5198 = output_struct->output_strides;
    local_5180 = cnn_config->layer_config;
    lVar16 = 0;
    local_51f0 = local_51d0;
    local_51f4 = local_51cc;
    pCVar14 = local_51d8;
    local_5188 = cnn_config;
    do {
      uVar19 = local_51f0;
      iVar10 = local_51f4;
      layer_config = local_5180 + lVar16;
      uVar8 = (ulong)local_5180[lVar16].branch;
      puVar18 = (undefined1 *)(uVar8 * 0x818);
      layer_active_tensor = local_2098 + uVar8;
      local_51e8 = uVar8;
      local_5178 = lVar16;
      if (lVar16 == 0) {
        uVar4 = layer_config->in_channels;
        layer_active_tensor->allocsize = 0;
        local_2098[uVar8].channels = uVar4;
        local_2098[uVar8].width = local_51d0;
        local_2098[uVar8].height = local_51cc;
        local_2098[uVar8].stride = local_51ac;
        if (local_51a0 == (float **)0x0) {
          output_struct = (CNN_MULTI_OUT *)(ulong)local_51f0;
          if (0 < (int)uVar4) {
            memset(local_2098[uVar8].buf,0,(ulong)uVar4 << 3);
            goto LAB_003af105;
          }
        }
        else {
          output_struct = (CNN_MULTI_OUT *)(ulong)local_51f0;
          if (0 < (int)uVar4) {
            memcpy(local_2098[uVar8].buf,local_51a0,(ulong)uVar4 << 3);
LAB_003af105:
            output_struct = (CNN_MULTI_OUT *)(ulong)uVar19;
          }
        }
      }
      else {
        memcpy(&local_28b8,layer_active_tensor,0x818);
        memcpy(layer_active_tensor,local_4918 + (long)puVar18,0x818);
        memcpy(local_4918 + (long)puVar18,&local_28b8,0x818);
        output_struct = (CNN_MULTI_OUT *)(ulong)(uint)local_2098[uVar8].width;
        iVar10 = local_2098[uVar8].height;
      }
      uVar19 = (uint)output_struct;
      av1_find_cnn_layer_output_size(uVar19,iVar10,layer_config,&local_51f8,&local_51fc);
      local_51c0 = (long)layer_config->output_num;
      tensor = (TENSOR *)(local_4918 + (long)puVar18);
      local_51f4 = iVar10;
      local_51f0 = uVar19;
      if (local_51c0 == -1) {
        _Var3 = realloc_tensor(tensor,layer_config->out_channels,local_51f8,local_51fc);
        iVar10 = 0xb;
        if (_Var3) goto LAB_003af205;
      }
      else {
        if (tensor->allocsize != 0) {
          aom_free(*(void **)(local_48f8 + (long)(puVar18 + -8)));
          *(undefined8 *)(local_48f8 + (long)(puVar18 + -8)) = 0;
          tensor->allocsize = 0;
        }
        lVar16 = alStack_5150[local_51c0 + -1];
        uVar19 = layer_config->out_channels;
        iVar10 = local_5198[local_51c0];
        tensor->allocsize = 0;
        *(uint *)(local_4918 + uVar8 * 0x818 + 4) = uVar19;
        *(int *)(local_4918 + (long)(puVar18 + 8)) = local_51f8;
        *(int *)(local_4918 + (long)(puVar18 + 0xc)) = local_51fc;
        *(int *)(local_4918 + (long)(puVar18 + 0x10)) = iVar10;
        if (lVar16 == 0) {
          if (0 < (int)uVar19) {
            memset(local_48f8 + (long)(puVar18 + -8),0,(ulong)uVar19 << 3);
          }
        }
        else if (0 < (int)uVar19) {
          uVar9 = 0;
          do {
            *(undefined8 *)(local_48f8 + (long)(puVar18 + uVar9 * 8 + -8)) =
                 *(undefined8 *)(lVar16 + uVar9 * 8);
            uVar9 = uVar9 + 1;
          } while (uVar19 != uVar9);
        }
LAB_003af205:
        if (layer_config->branch_copy_type == '\x01') {
          _Var3 = copy_active_tensor_to_branches
                            (layer_active_tensor,layer_config,(int)local_51e8,(TENSOR *)local_4918);
          iVar10 = 0xb;
          if (!_Var3) goto LAB_003af7f4;
        }
        if (layer_config->deconvolve == 0) {
          output_struct = (CNN_MULTI_OUT *)(local_48f8 + (long)(puVar18 + -8));
          if (pCVar14->num_workers < 2) {
            av1_cnn_convolve(local_2098[uVar8].buf,local_2098[uVar8].width,local_2098[uVar8].height,
                             local_2098[uVar8].stride,layer_config,(float **)output_struct,
                             *(int *)(local_4918 + (long)(puVar18 + 0x10)),0,1);
          }
          else {
            local_51b8 = CONCAT44(local_51b8._4_4_,local_2098[uVar8].height);
            local_51ec = local_2098[uVar8].width;
            local_51a8 = *(int *)(local_4918 + (long)(puVar18 + 0x10));
            local_51a4 = local_2098[uVar8].stride;
            local_5190 = tensor;
            pAVar5 = aom_get_worker_interface();
            uVar19 = pCVar14->num_workers;
            local_51e0 = (ulong)uVar19;
            uVar4 = 0x20;
            if ((int)uVar19 < 0x20) {
              uVar4 = uVar19;
            }
            tensor = local_5190;
            if (0 < (int)uVar19) {
              local_5160 = (ulong)(uVar19 - 1);
              lVar16 = 0;
              uVar9 = 0;
              local_51c8 = puVar18;
              local_5170 = (TENSOR *)output_struct;
              local_5168 = local_2098[uVar8].buf;
              do {
                pAVar1 = local_51d8->workers;
                output_struct = (CNN_MULTI_OUT *)((long)&pAVar1->impl_ + lVar16);
                (*pAVar5->reset)((AVxWorker *)output_struct);
                pCVar14 = local_51d8;
                plVar6 = (long *)((long)local_28b8.buf + lVar16 + -0x18);
                *plVar6 = (long)local_5168;
                *(int *)((long)local_28b8.buf + lVar16 + -0x10) = local_51ec;
                *(undefined4 *)((long)local_28b8.buf + lVar16 + -0xc) = (undefined4)local_51b8;
                *(int *)((long)local_28b8.buf + lVar16 + -8) = local_51a4;
                *(CNN_LAYER_CONFIG **)((long)local_28b8.buf + lVar16) = layer_config;
                *(TENSOR **)((long)local_28b8.buf + lVar16 + 8) = local_5170;
                *(int *)((long)local_28b8.buf + lVar16 + 0x10) = local_51a8;
                *(int *)((long)local_28b8.buf + lVar16 + 0x14) = (int)uVar9;
                *(int *)((long)local_28b8.buf + lVar16 + 0x18) = (int)local_51e0;
                *(code **)((long)&pAVar1->hook + lVar16) = convolve_layer;
                *(long **)((long)&pAVar1->data1 + lVar16) = plVar6;
                *(undefined8 *)((long)&pAVar1->data2 + lVar16) = 0;
                (*(&pAVar5->launch)[local_5160 == uVar9])((AVxWorker *)output_struct);
                puVar18 = local_51c8;
                uVar9 = uVar9 + 1;
                lVar16 = lVar16 + 0x38;
              } while (uVar4 != uVar9);
              tensor = local_5190;
              if (0 < (int)local_51e0) {
                output_struct = (CNN_MULTI_OUT *)((ulong)uVar4 * 0x38);
                lVar16 = 0;
                do {
                  (*pAVar5->sync)((AVxWorker *)((long)&pCVar14->workers->impl_ + lVar16));
                  lVar16 = lVar16 + 0x38;
                  tensor = local_5190;
                } while ((long)output_struct - lVar16 != 0);
              }
            }
          }
        }
        else {
          av1_cnn_deconvolve_c
                    (local_2098[uVar8].buf,local_2098[uVar8].width,local_2098[uVar8].height,
                     local_2098[uVar8].stride,layer_config,
                     (float **)(local_48f8 + (long)(puVar18 + -8)),
                     *(int *)(local_4918 + (long)(puVar18 + 0x10)));
        }
        if (layer_config->branch_copy_type == '\x02') {
          _Var3 = copy_active_tensor_to_branches
                            (tensor,layer_config,(int)local_51e8,(TENSOR *)local_4918);
          iVar10 = 0xb;
          if (!_Var3) goto LAB_003af7f4;
        }
        if (layer_config->branch_combine_type == '\x01') {
          uVar9 = local_51e8 & 0xffffffff;
          ppfVar11 = (float **)(local_4918 + 0x18);
          uVar8 = 0;
          do {
            if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar8 & 0x1f) &
                 1) != 0) && (uVar9 != uVar8)) {
              av1_cnn_add_c((float **)(local_4918 + (long)(puVar18 + 0x18)),tensor->channels,
                            tensor->width,tensor->height,tensor->stride,ppfVar11);
            }
            uVar8 = uVar8 + 1;
            ppfVar11 = ppfVar11 + 0x103;
          } while (uVar8 != 4);
        }
        output_struct = (CNN_MULTI_OUT *)(local_4918 + (long)(puVar18 + 0x18));
        av1_cnn_activate_c((float **)output_struct,*(int *)(local_4918 + (long)(puVar18 + 4)),
                           *(int *)(local_4918 + (long)(puVar18 + 8)),
                           *(int *)(local_4918 + (long)(puVar18 + 0xc)),
                           *(int *)(local_4918 + (long)(puVar18 + 0x10)),layer_config->activation);
        pfVar2 = (layer_config->bn_params).bn_gamma;
        if (pfVar2 != (float *)0x0) {
          av1_cnn_batchnorm_c((float **)output_struct,tensor->channels,tensor->width,tensor->height,
                              tensor->stride,pfVar2,(layer_config->bn_params).bn_beta,
                              (layer_config->bn_params).bn_mean,(layer_config->bn_params).bn_std);
        }
        pCVar14 = local_51d8;
        if (layer_config->branch_combine_type == '\x02') {
          if ((int)local_51c0 == -1) {
            local_51e0 = local_51e8 & 0xffffffff;
            local_51c8 = puVar18 + (long)local_48f8;
            uVar8 = 0;
            bVar20 = false;
            do {
              if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar8 & 0x1f)
                   & 1) != 0) && (uVar8 != local_51e0)) {
                lVar16 = uVar8 * 0x818;
                iVar10 = tensor->channels;
                uVar4 = *(int *)(local_4918 + lVar16 + 4) + iVar10;
                uVar19 = tensor->width;
                output_struct = (CNN_MULTI_OUT *)(ulong)uVar19;
                iVar15 = tensor->height;
                if (tensor->allocsize < (int)(uVar19 * iVar15 * uVar4)) {
                  local_51ec = iVar10;
                  local_51b8 = lVar16;
                  memset(&local_5130,0,0x818);
                  _Var3 = realloc_tensor(&local_5130,uVar4,uVar19,iVar15);
                  if (!_Var3) {
                    iVar10 = 0xb;
                    goto LAB_003af7bf;
                  }
                  copy_tensor(tensor,tensor->channels,0,&local_5130);
                  output_struct = (CNN_MULTI_OUT *)&local_28b8;
                  memcpy(output_struct,tensor,0x818);
                  memcpy(tensor,&local_5130,0x818);
                  memcpy(&local_5130,output_struct,0x818);
                  lVar16 = local_51b8;
                  iVar10 = local_51ec;
                  if (local_5130.allocsize != 0) {
                    aom_free(local_5130.buf[0]);
                    local_5130.buf[0] = (float *)0x0;
                    local_5130.allocsize = 0;
                    lVar16 = local_51b8;
                    iVar10 = local_51ec;
                  }
                }
                if (1 < (int)uVar4) {
                  pfVar2 = tensor->buf[0];
                  iVar7 = tensor->height * tensor->width;
                  lVar17 = 0;
                  iVar15 = iVar7;
                  do {
                    *(float **)(local_51c8 + lVar17 * 8) = pfVar2 + iVar15;
                    lVar17 = lVar17 + 1;
                    iVar15 = iVar15 + iVar7;
                  } while ((ulong)uVar4 - 1 != lVar17);
                }
                copy_tensor((TENSOR *)(local_4918 + lVar16),*(int *)(local_4918 + lVar16 + 4),iVar10
                            ,tensor);
              }
              bVar20 = 2 < uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 4);
            iVar10 = 0xf;
LAB_003af7bf:
            pCVar14 = local_51d8;
            if (!bVar20) goto LAB_003af7f4;
          }
          else {
            uVar19 = tensor->channels;
            uVar9 = local_51e8 & 0xffffffff;
            piVar12 = (int *)(local_4918 + 4);
            uVar8 = 0;
            uVar4 = uVar19;
            do {
              if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar8 & 0x1f)
                   & 1) != 0) && (uVar9 != uVar8)) {
                uVar4 = uVar4 + *piVar12;
              }
              uVar8 = uVar8 + 1;
              piVar12 = piVar12 + 0x206;
            } while (uVar8 != 4);
            lVar16 = alStack_5150[local_51c0 + -1];
            iVar10 = local_5198[local_51c0];
            tensor->allocsize = 0;
            tensor->channels = uVar4;
            tensor->width = local_51f8;
            tensor->height = local_51fc;
            tensor->stride = iVar10;
            if (lVar16 == 0) {
              if (0 < (int)uVar4) {
                memset(output_struct,0,(ulong)uVar4 << 3);
              }
            }
            else if (0 < (int)uVar4) {
              uVar8 = 0;
              do {
                ((TENSOR *)output_struct)->buf[uVar8 - 3] = *(float **)(lVar16 + uVar8 * 8);
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
            output_struct = (CNN_MULTI_OUT *)local_4918;
            uVar8 = 0;
            do {
              if ((((uint)(layer_config->branch_config).branches_to_combine >> ((uint)uVar8 & 0x1f)
                   & 1) != 0) && (uVar9 != uVar8)) {
                copy_tensor((TENSOR *)output_struct,((TENSOR *)output_struct)->channels,uVar19,
                            tensor);
                uVar19 = uVar19 + ((TENSOR *)output_struct)->channels;
              }
              uVar8 = uVar8 + 1;
              output_struct = (CNN_MULTI_OUT *)((long)output_struct + 0x818);
            } while (uVar8 != 4);
          }
        }
        if (layer_config->branch_copy_type == '\x03') {
          _Var3 = copy_active_tensor_to_branches
                            (tensor,layer_config,(int)local_51e8,(TENSOR *)local_4918);
          iVar10 = 0xb;
          if (!_Var3) goto LAB_003af7f4;
        }
        iVar10 = 0;
      }
LAB_003af7f4:
      bVar13 = (byte)output_struct;
      if (iVar10 != 0) goto LAB_003af81c;
      lVar16 = local_5178 + 1;
    } while (lVar16 < local_5188->num_layers);
  }
  bVar13 = (byte)output_struct;
  iVar10 = 8;
LAB_003af81c:
  if (iVar10 == 0xb) {
    bVar13 = 0;
  }
  else {
    if (iVar10 != 8) goto LAB_003af89f;
    bVar13 = 1;
  }
  lVar16 = 0;
  do {
    if (*(int *)((long)local_2098[0].buf + lVar16 + -0x18) != 0) {
      aom_free(*(void **)((long)local_2098[0].buf + lVar16));
      *(undefined8 *)((long)local_2098[0].buf + lVar16) = 0;
      *(undefined4 *)((long)local_2098[0].buf + lVar16 + -0x18) = 0;
    }
    if (*(int *)(local_4918 + lVar16) != 0) {
      aom_free(*(void **)(local_4918 + lVar16 + 0x18));
      *(undefined8 *)(local_4918 + lVar16 + 0x18) = 0;
      *(undefined4 *)(local_4918 + lVar16) = 0;
    }
    lVar16 = lVar16 + 0x818;
  } while (lVar16 != 0x2060);
LAB_003af89f:
  return (_Bool)(bVar13 & 1);
}

Assistant:

bool av1_cnn_predict_c(const float **input, int in_width, int in_height,
                       int in_stride, const CNN_CONFIG *cnn_config,
                       const CNN_THREAD_DATA *thread_data,
                       CNN_MULTI_OUT *output_struct) {
  bool success = false;
  TENSOR tensor1[CNN_MAX_BRANCHES] = { { 0 } };
  TENSOR tensor2[CNN_MAX_BRANCHES] = { { 0 } };

  float **output[CNN_MAX_BRANCHES];
  const int *out_chs = output_struct->output_channels;
  output[0] = output_struct->output_buffer;
  for (int out_idx = 1; out_idx < output_struct->num_outputs; out_idx++) {
    output[out_idx] = output[out_idx - 1] + out_chs[out_idx - 1];
  }

  int i_width = in_width;
  int i_height = in_height;
  int o_width = 0, o_height = 0;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    init_tensor(&tensor1[b]);
    init_tensor(&tensor2[b]);
  }

  const int *out_stride = output_struct->output_strides;
  for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[layer];
    const int branch = layer_config->branch;
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;

    // Allocate input tensor
    if (layer == 0) {       // First layer
      assert(branch == 0);  // First layer must be primary branch
      assign_tensor(&tensor1[branch], (float **)input,
                    layer_config->in_channels, in_width, in_height, in_stride);
    } else {  // Non-first layer
      // Swap tensor1 and tensor2
      swap_tensor(&tensor1[branch], &tensor2[branch]);

      i_width = tensor1[branch].width;
      i_height = tensor1[branch].height;
    }

    // Allocate output tensor
    av1_find_cnn_layer_output_size(i_width, i_height, layer_config, &o_width,
                                   &o_height);
    const int output_num = layer_config->output_num;
    if (output_num == -1) {  // Non-output layer
      if (!realloc_tensor(&tensor2[branch], layer_config->out_channels, o_width,
                          o_height)) {
        goto Error;
      }
    } else {  // Output layer
      free_tensor(&tensor2[branch]);
      assign_tensor(&tensor2[branch], output[output_num],
                    layer_config->out_channels, o_width, o_height,
                    out_stride[output_num]);
    }

    // If we are combining branches make sure that the branch to combine
    // is different from the current branch.
    assert(IMPLIES(layer_config->branch_combine_type != BRANCH_NOC,
                   !(branch_config->branches_to_combine & (1 << branch))));

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      if (!copy_active_tensor_to_branches(&tensor1[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
    // Check consistency of input and output channels
    assert(tensor1[branch].channels == layer_config->in_channels);
    assert(tensor2[branch].channels == layer_config->out_channels);

    // Convolve/Deconvolve
    if (!cnn_config->layer_config[layer].deconvolve) {
      if (thread_data->num_workers > 1) {
        convolve_layer_mt((const float **)tensor1[branch].buf,
                          tensor1[branch].width, tensor1[branch].height,
                          tensor1[branch].stride, layer_config, thread_data,
                          tensor2[branch].buf, tensor2[branch].stride);
      } else {
        av1_cnn_convolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride, 0, 1);
      }
    } else {
      av1_cnn_deconvolve((const float **)tensor1[branch].buf,
                         tensor1[branch].width, tensor1[branch].height,
                         tensor1[branch].stride, layer_config,
                         tensor2[branch].buf, tensor2[branch].stride);
    }

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }

    // Add tensors from other branches if needed
    if (layer_config->branch_combine_type == BRANCH_ADD) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
          assert(check_tensor_equal_size(&tensor2[b], &tensor2[branch]));
          av1_cnn_add(tensor2[branch].buf, tensor2[branch].channels,
                      tensor2[branch].width, tensor2[branch].height,
                      tensor2[branch].stride, (const float **)tensor2[b].buf);
        }
      }
    }

    // Non-linearity
    av1_cnn_activate(tensor2[branch].buf, tensor2[branch].channels,
                     tensor2[branch].width, tensor2[branch].height,
                     tensor2[branch].stride, layer_config->activation);

    if (layer_config->bn_params.bn_gamma) {
      av1_cnn_batchnorm(
          tensor2[branch].buf, tensor2[branch].channels, tensor2[branch].width,
          tensor2[branch].height, tensor2[branch].stride,
          layer_config->bn_params.bn_gamma, layer_config->bn_params.bn_beta,
          layer_config->bn_params.bn_mean, layer_config->bn_params.bn_std);
    }

    // Concatenate tensors
    if (layer_config->branch_combine_type == BRANCH_CAT) {
      if (output_num == -1) {  // Non-output layer
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            assert(tensor2[b].channels > 0);
            if (!concat_tensor(&tensor2[b], &tensor2[branch])) goto Error;
          }
        }
      } else {  // Output layer
        const int existing_channels = tensor2[branch].channels;
        int num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            num_chs += tensor2[b].channels;
          }
        }
        assign_tensor(&tensor2[branch], output[output_num], num_chs, o_width,
                      o_height, out_stride[output_num]);

        num_chs = existing_channels;
        for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
          if ((branch_config->branches_to_combine & (1 << b)) && b != branch) {
            assert(check_tensor_equal_dims(&tensor2[b], &tensor2[branch]));
            // Needed only to assign the new channel buffers
            copy_tensor(&tensor2[b], tensor2[b].channels, num_chs,
                        &tensor2[branch]);
            num_chs += tensor2[b].channels;
          }
        }
      }
    }

    if (layer_config->branch_copy_type == BRANCH_COMBINED) {
      if (!copy_active_tensor_to_branches(&tensor2[branch], layer_config,
                                          branch, tensor2)) {
        goto Error;
      }
    }
  }

  success = true;
Error:
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    free_tensor(&tensor1[b]);
    free_tensor(&tensor2[b]);
  }
  return success;
}